

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark.cpp
# Opt level: O0

void onConnect(int fd)

{
  size_type __n;
  element_type *peVar1;
  undefined1 local_118 [16];
  anon_class_16_1_8989fd51 local_108;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> local_f8;
  undefined1 local_d8 [16];
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> local_c8;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  Ptr sc;
  Ptr buff;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string msg;
  int fd_local;
  
  msg.field_2._12_4_ = fd;
  printf("onConnect\n");
  __n = (size_type)packetSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,__n,'a',&local_31);
  std::allocator<char>::~allocator(&local_31);
  hwnet::Buffer::New((Buffer *)
                     &sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(string *)local_30);
  hwnet::TCPSocket::New((TCPSocket *)local_68,&poller_,msg.field_2._12_4_);
  peVar1 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::
  function<void(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)>
  ::
  function<void(&)(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long),void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)>
              *)&local_a8,onDataClient);
  hwnet::TCPSocket::SetRecvCallback((TCPSocket *)local_88,(RecvCallback *)peVar1);
  peVar1 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  std::function<void(std::shared_ptr<hwnet::TCPSocket>const&,int)>::
  function<void(&)(std::shared_ptr<hwnet::TCPSocket>const&,int),void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&,int)> *)(local_d8 + 0x10),
             onError);
  hwnet::TCPSocket::SetErrorCallback((TCPSocket *)(local_88 + 0x10),(ErrorCallback *)peVar1);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)(local_88 + 0x10));
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)(local_d8 + 0x10));
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_88);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::~function(&local_a8);
  peVar1 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::shared_ptr<hwnet::Buffer>::shared_ptr
            (&local_108.buff,
             (shared_ptr<hwnet::Buffer> *)
             &sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::function<void(std::shared_ptr<hwnet::TCPSocket>const&)>::function<onConnect(int)::__0,void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&)> *)&local_f8,&local_108);
  hwnet::TCPSocket::SetFlushCallback((TCPSocket *)local_d8,(FlushCallback *)peVar1);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_d8);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function(&local_f8);
  onConnect(int)::$_0::~__0((__0 *)&local_108);
  std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  hwnet::TCPSocket::Start((TCPSocket *)local_118);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_118);
  peVar1 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  hwnet::TCPSocket::Send
            (peVar1,(Ptr *)&sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,0);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_68);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr
            ((shared_ptr<hwnet::Buffer> *)
             &sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect\n");
	std::string msg = std::string(packetSize,'a');
	auto buff = Buffer::New(msg);
	auto sc = TCPSocket::New(&poller_,fd);
	sc->SetRecvCallback(onDataClient)->SetErrorCallback(onError);
	sc->SetFlushCallback([buff](const TCPSocket::Ptr &s){
		s->Recv(buff);
	});
	sc->Start();
	sc->Send(buff);
}